

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqdec.c
# Opt level: O2

int jpc_mqdec_lpsexchrenormd(jpc_mqdec_t *mqdec)

{
  _Bool _Var1;
  uchar uVar2;
  int iVar3;
  ulong uVar4;
  jpc_mqstate_t *pjVar5;
  ulong uVar6;
  jas_stream_t *stream;
  uint_fast32_t uVar7;
  byte *pbVar8;
  uint uVar9;
  uint_fast32_t uVar10;
  uint_fast32_t uVar11;
  
  uVar4 = mqdec->areg;
  pjVar5 = *mqdec->curctx;
  uVar6 = pjVar5->qeval;
  _Var1 = pjVar5->mps;
  mqdec->areg = uVar6;
  *mqdec->curctx = (&pjVar5->nmps)[uVar6 <= uVar4];
  uVar10 = mqdec->ctreg;
  do {
    if (uVar10 == 0) {
      uVar10 = 7;
      if (mqdec->eof == 0) {
        stream = mqdec->in;
        if ((stream->flags_ & 7U) == 0) {
          if ((-1 < stream->rwlimit_) && (stream->rwlimit_ <= stream->rwcnt_)) {
            stream->flags_ = stream->flags_ | 4;
            goto LAB_00122616;
          }
          iVar3 = stream->cnt_;
          stream->cnt_ = iVar3 + -1;
          if (iVar3 < 1) {
            uVar9 = jas_stream_fillbuf(stream,1);
            if (uVar9 == 0xffffffff) goto LAB_00122616;
          }
          else {
            stream->rwcnt_ = stream->rwcnt_ + 1;
            pbVar8 = stream->ptr_;
            stream->ptr_ = pbVar8 + 1;
            uVar9 = (uint)*pbVar8;
          }
        }
        else {
LAB_00122616:
          mqdec->eof = 1;
          uVar9 = 0xff;
        }
        uVar2 = mqdec->inbuffer;
        mqdec->inbuffer = (uchar)uVar9;
        if (uVar2 == 0xff) {
          if (0x8f < (int)uVar9) goto LAB_00122603;
          uVar11 = (long)(int)(uVar9 << 9) + mqdec->creg;
          uVar10 = 6;
        }
        else {
          uVar11 = (long)(int)(uVar9 << 8) + mqdec->creg;
        }
      }
      else {
LAB_00122603:
        uVar11 = mqdec->creg + 0xff00;
      }
    }
    else {
      uVar11 = mqdec->creg;
      uVar10 = uVar10 - 1;
    }
    uVar7 = mqdec->areg;
    mqdec->areg = uVar7 * 2;
    mqdec->creg = uVar11 * 2;
    mqdec->ctreg = uVar10;
    if (((uint)uVar7 >> 0xe & 1) != 0) {
      return (int)(byte)(_Var1 ^ uVar6 <= uVar4);
    }
  } while( true );
}

Assistant:

int jpc_mqdec_lpsexchrenormd(register jpc_mqdec_t *mqdec)
{
	int ret;
	register const jpc_mqstate_t *state = *mqdec->curctx;
	jpc_mqdec_lpsexchange(mqdec->areg, state->qeval, mqdec->curctx, ret);
	jpc_mqdec_renormd(mqdec->areg, mqdec->creg, mqdec->ctreg, mqdec->in,
	  mqdec->eof, mqdec->inbuffer);
	return ret;
}